

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_h264e_vepu2_wait_v2(void *hal,HalEncTask *task)

{
  MppPacket s;
  RK_S32 type_00;
  MPP_RET MVar1;
  size_t sVar2;
  HalH264eVepuStreamAmend *ctx_00;
  HalH264eVepuStreamAmend *amend;
  MPP_RET ret;
  RK_S32 offset;
  MppPacket pkt;
  H264NaluType type;
  HalH264eVepuMbRc *hw_mbrc;
  HalH264eVepu2Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  type_00 = 1;
  if (((task->rc_task->frm).val >> 5 & 1) != 0) {
    type_00 = 5;
  }
  s = task->packet;
  sVar2 = mpp_packet_get_length(s);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_wait_v2",hal);
  }
  if (*(long *)((long)hal + 8) == 0) {
    _mpp_log_l(2,"hal_h264e_vepu2_v2","invalid NULL device ctx\n",(char *)0x0);
    hal_local._4_4_ = MPP_NOK;
  }
  else {
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"hal_h264e_vepu2_v2","poll cmd failed %d\n","hal_h264e_vepu2_wait_v2",
                 (ulong)(uint)MVar1);
    }
    h264e_vepu2_get_mbrc
              ((HalH264eVepuMbRc *)((long)hal + 0x198),(H264eVpu2RegSet *)((long)hal + 0x5e0));
    h264e_vepu_mbrc_update
              (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198));
    mpp_packet_add_segment_info(s,type_00,(RK_S32)sVar2,*(RK_S32 *)((long)hal + 0x21c));
    ctx_00 = (HalH264eVepuStreamAmend *)((long)hal + 0x298);
    if (ctx_00->enable == 0) {
      if (*(long *)((long)hal + 0x2a8) != 0) {
        *(undefined4 *)((long)hal + 0x2ec) = *(undefined4 *)((long)hal + 0x21c);
        h264e_vepu_stream_amend_sync_ref_idc(ctx_00);
      }
    }
    else {
      *(undefined4 *)((long)hal + 0x2ec) = *(undefined4 *)((long)hal + 0x21c);
      h264e_vepu_stream_amend_proc(ctx_00,(MppEncH264HwCfg *)(*hal + 0x360));
      *(undefined4 *)((long)hal + 0x21c) = *(undefined4 *)((long)hal + 0x2f0);
    }
    task->hw_length = *(int *)((long)hal + 0x21c) + task->hw_length;
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_wait_v2",hal);
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu2_wait_v2(void *hal, HalEncTask *task)
{
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);
    MPP_RET ret = MPP_NOK;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    } else {
        mpp_err("invalid NULL device ctx\n");
        return ret;
    }

    h264e_vepu2_get_mbrc(hw_mbrc, &ctx->regs_get);
    h264e_vepu_mbrc_update(ctx->rc_ctx, hw_mbrc);

    mpp_packet_add_segment_info(pkt, type, offset, hw_mbrc->out_strm_size);

    {
        HalH264eVepuStreamAmend *amend = &ctx->amend;

        if (amend->enable) {
            amend->old_length = hw_mbrc->out_strm_size;
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            ctx->hw_mbrc.out_strm_size = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = hw_mbrc->out_strm_size;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }

    task->hw_length += ctx->hw_mbrc.out_strm_size;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}